

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  color_quad<unsigned_char,_int> *pcVar1;
  uint y;
  uint x;
  uint uVar2;
  uint uVar3;
  uchar uVar4;
  
  for (y = 0; y < this->m_height; y = y + 1) {
    for (uVar2 = 0; uVar2 < this->m_width; uVar2 = uVar2 + 1) {
      pcVar1 = this->m_pPixels;
      uVar3 = this->m_pitch * y + uVar2;
      uVar4 = (uchar)((uint)pcVar1[uVar3].field_0.field_0.b * 0x1d2f +
                      (uint)pcVar1[uVar3].field_0.field_0.g * 0x9646 +
                      (uint)pcVar1[uVar3].field_0.field_0.r * 0x4c8b + 0x8000 >> 0x10);
      pcVar1[uVar3].field_0.field_0.r = uVar4;
      pcVar1[uVar3].field_0.field_0.g = uVar4;
      pcVar1[uVar3].field_0.field_0.b = uVar4;
    }
  }
  *(byte *)&this->m_comp_flags = (byte)this->m_comp_flags | 0x10;
  return;
}

Assistant:

void convert_to_grayscale()
        {
            for (uint y = 0; y < m_height; y++)
            {
                for (uint x = 0; x < m_width; x++)
                {
                    color_type c((*this)(x, y));
                    typename color_type::component_t l = static_cast<typename color_type::component_t>(c.get_luma());
                    c.r = l;
                    c.g = l;
                    c.b = l;
                    (*this)(x, y) = c;
                }
            }

            set_grayscale(true);
        }